

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O0

void If_CluCountOnesInCofs(word *pTruth,int nVars,int *pStore)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int local_30;
  int Limit;
  int nOnes;
  int k;
  int i;
  int nWords;
  int *pStore_local;
  int nVars_local;
  word *pTruth_local;
  
  iVar1 = If_CluWordNum(nVars);
  local_30 = 0;
  iVar2 = Abc_MinInt(nVars,6);
  memset(pStore,0,(long)nVars << 3);
  for (Limit = 0; Limit < iVar1; Limit = Limit + 1) {
    for (nOnes = 0; nOnes < iVar2; nOnes = nOnes + 1) {
      iVar3 = If_CluCountOnes(pTruth[Limit] & Truth6[nOnes]);
      iVar4 = nOnes * 2 + 1;
      pStore[iVar4] = iVar3 + pStore[iVar4];
    }
  }
  if (6 < nVars) {
    for (Limit = 0; Limit < iVar1; Limit = Limit + 1) {
      for (nOnes = 6; nOnes < nVars; nOnes = nOnes + 1) {
        if ((Limit & 1 << ((char)nOnes - 6U & 0x1f)) != 0) {
          iVar2 = If_CluCountOnes(pTruth[Limit]);
          iVar3 = nOnes * 2 + 1;
          pStore[iVar3] = iVar2 + pStore[iVar3];
        }
      }
    }
  }
  for (Limit = 0; Limit < iVar1; Limit = Limit + 1) {
    iVar2 = If_CluCountOnes(pTruth[Limit]);
    local_30 = iVar2 + local_30;
  }
  for (nOnes = 0; nOnes < nVars; nOnes = nOnes + 1) {
    pStore[nOnes << 1] = local_30 - pStore[nOnes * 2 + 1];
  }
  return;
}

Assistant:

void If_CluCountOnesInCofs( word * pTruth, int nVars, int * pStore )
{
    int nWords = If_CluWordNum( nVars );
    int i, k, nOnes = 0, Limit = Abc_MinInt( nVars, 6 );
    memset( pStore, 0, sizeof(int) * 2 * nVars );
    // compute positive cofactors
    for ( k = 0; k < nWords; k++ )
        for ( i = 0; i < Limit; i++ )
            pStore[2*i+1] += If_CluCountOnes( pTruth[k] & Truth6[i] );
    if ( nVars > 6 )
    for ( k = 0; k < nWords; k++ )
        for ( i = 6; i < nVars; i++ )
            if ( k & (1 << (i-6)) )
                pStore[2*i+1] += If_CluCountOnes( pTruth[k] );
    // compute negative cofactors
    for ( k = 0; k < nWords; k++ )
        nOnes += If_CluCountOnes( pTruth[k] );
    for ( i = 0; i < nVars; i++ )
        pStore[2*i] = nOnes - pStore[2*i+1];
}